

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

QDateTime __thiscall QFSFileEngine::fileTime(QFSFileEngine *this,FileTime time)

{
  byte *pbVar1;
  QFSFileEnginePrivate *this_00;
  bool bVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  
  this_00 = *(QFSFileEnginePrivate **)(CONCAT44(in_register_00000034,time) + 8);
  if (in_EDX == 0) {
    pbVar1 = (byte *)((long)&(this_00->metaData).knownFlagsMask.
                             super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 3);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  bVar2 = QFSFileEnginePrivate::doStat(this_00,(MetaDataFlags)0x2000000);
  if (bVar2) {
    QFileSystemMetaData::fileTime((QFileSystemMetaData *)this,(int)this_00 + 0x70);
  }
  else {
    QDateTime::QDateTime((QDateTime *)this);
  }
  return (QDateTime)(Data)this;
}

Assistant:

QDateTime QFSFileEngine::fileTime(QFile::FileTime time) const
{
    Q_D(const QFSFileEngine);

    if (time == QFile::FileAccessTime) {
        // always refresh for the access time
        d->metaData.clearFlags(QFileSystemMetaData::AccessTime);
    }

    if (d->doStat(QFileSystemMetaData::Times))
        return d->metaData.fileTime(time);

    return QDateTime();
}